

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O0

LArNESTResult * __thiscall
NEST::LArNEST::FullCalculation
          (LArNESTResult *__return_storage_ptr__,LArNEST *this,LArInteraction species,double energy,
          double dx,double efield,double density,bool do_times)

{
  LArYieldFluctuationResult local_c0;
  LArYieldResult local_90;
  undefined1 local_42;
  undefined1 local_41;
  double dStack_40;
  bool do_times_local;
  double density_local;
  double efield_local;
  double dx_local;
  double energy_local;
  LArNEST *pLStack_18;
  LArInteraction species_local;
  LArNEST *this_local;
  LArNESTResult *result;
  
  local_41 = do_times;
  dStack_40 = density;
  density_local = efield;
  efield_local = dx;
  dx_local = energy;
  energy_local._4_4_ = species;
  pLStack_18 = this;
  this_local = (LArNEST *)__return_storage_ptr__;
  if (density < 1.0) {
    VDetector::set_inGas((this->super_NESTcalc).fdetector,true);
  }
  local_42 = 0;
  LArNESTResult::LArNESTResult(__return_storage_ptr__);
  GetYields(&local_90,this,energy_local._4_4_,dx_local,efield_local,density_local,dStack_40);
  (__return_storage_ptr__->yields).ElectricField = local_90.ElectricField;
  (__return_storage_ptr__->yields).Nion = local_90.Nion;
  (__return_storage_ptr__->yields).Lindhard = local_90.Lindhard;
  (__return_storage_ptr__->yields).Ne = local_90.Ne;
  (__return_storage_ptr__->yields).Nex = local_90.Nex;
  (__return_storage_ptr__->yields).LightYield = local_90.LightYield;
  (__return_storage_ptr__->yields).Nph = local_90.Nph;
  (__return_storage_ptr__->yields).TotalYield = local_90.TotalYield;
  (__return_storage_ptr__->yields).QuantaYield = local_90.QuantaYield;
  GetYieldFluctuations(&local_c0,this,energy_local._4_4_,&__return_storage_ptr__->yields,dStack_40);
  (__return_storage_ptr__->fluctuations).NphFluctuation = local_c0.NphFluctuation;
  (__return_storage_ptr__->fluctuations).NeFluctuation = local_c0.NeFluctuation;
  (__return_storage_ptr__->fluctuations).NexFluctuation = local_c0.NexFluctuation;
  (__return_storage_ptr__->fluctuations).NionFluctuation = local_c0.NionFluctuation;
  return __return_storage_ptr__;
}

Assistant:

LArNESTResult LArNEST::FullCalculation(LArInteraction species, double energy,
                                       double dx, double efield, double density,
                                       bool do_times) {
  if (density < 1.) fdetector->set_inGas(true);
  LArNESTResult result;
  result.yields = GetYields(species, energy, dx, efield, density);
  result.fluctuations = GetYieldFluctuations(species, result.yields, density);
  // if (do_times)
  //     result.photon_times = GetPhotonTimes(
  //         species, result.quanta.photons,
  //         result.quanta.excitons, efield, energy
  //     );
  // else {
  //     result.photon_times = photonstream(result.quanta.photons, 0.0);
  // }
  return result;
}